

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-active.c
# Opt level: O3

int run_test_active(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 extraout_RAX;
  undefined8 in_R9;
  uv_timer_t timer;
  undefined1 local_a0 [152];
  
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,local_a0);
  if (iVar1 == 0) {
    iVar1 = uv_is_active(local_a0);
    if (iVar1 != 0) goto LAB_0014bfd1;
    iVar1 = uv_is_closing(local_a0);
    if (iVar1 != 0) goto LAB_0014bfd6;
    iVar1 = uv_timer_start(local_a0,timer_cb,1000,0);
    if (iVar1 != 0) goto LAB_0014bfdb;
    iVar1 = uv_is_active(local_a0);
    if (iVar1 != 1) goto LAB_0014bfe0;
    iVar1 = uv_is_closing(local_a0);
    if (iVar1 != 0) goto LAB_0014bfe5;
    iVar1 = uv_timer_stop(local_a0);
    if (iVar1 != 0) goto LAB_0014bfea;
    iVar1 = uv_is_active(local_a0);
    if (iVar1 != 0) goto LAB_0014bfef;
    iVar1 = uv_is_closing(local_a0);
    if (iVar1 != 0) goto LAB_0014bff4;
    iVar1 = uv_timer_start(local_a0,timer_cb,1000,0);
    if (iVar1 != 0) goto LAB_0014bff9;
    iVar1 = uv_is_active(local_a0);
    if (iVar1 != 1) goto LAB_0014bffe;
    iVar1 = uv_is_closing(local_a0);
    if (iVar1 != 0) goto LAB_0014c003;
    uv_close(local_a0,close_cb);
    iVar1 = uv_is_active(local_a0);
    if (iVar1 != 0) goto LAB_0014c008;
    iVar1 = uv_is_closing(local_a0);
    if (iVar1 != 1) goto LAB_0014c00d;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_0014c012;
    if (close_cb_called == 1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0014c01c;
    }
  }
  else {
    run_test_active_cold_1();
LAB_0014bfd1:
    run_test_active_cold_2();
LAB_0014bfd6:
    run_test_active_cold_3();
LAB_0014bfdb:
    run_test_active_cold_4();
LAB_0014bfe0:
    run_test_active_cold_5();
LAB_0014bfe5:
    run_test_active_cold_6();
LAB_0014bfea:
    run_test_active_cold_7();
LAB_0014bfef:
    run_test_active_cold_8();
LAB_0014bff4:
    run_test_active_cold_9();
LAB_0014bff9:
    run_test_active_cold_10();
LAB_0014bffe:
    run_test_active_cold_11();
LAB_0014c003:
    run_test_active_cold_12();
LAB_0014c008:
    run_test_active_cold_13();
LAB_0014c00d:
    run_test_active_cold_14();
LAB_0014c012:
    run_test_active_cold_15();
  }
  run_test_active_cold_16();
LAB_0014c01c:
  run_test_active_cold_17();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-active.c"
          ,0x27,"0 && \"timer_cb should not have been called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

TEST_IMPL(active) {
  int r;
  uv_timer_t timer;

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT(r == 0);

  /* uv_is_active() and uv_is_closing() should always return either 0 or 1. */
  ASSERT(0 == uv_is_active((uv_handle_t*) &timer));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &timer));

  r = uv_timer_start(&timer, timer_cb, 1000, 0);
  ASSERT(r == 0);

  ASSERT(1 == uv_is_active((uv_handle_t*) &timer));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &timer));

  r = uv_timer_stop(&timer);
  ASSERT(r == 0);

  ASSERT(0 == uv_is_active((uv_handle_t*) &timer));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &timer));

  r = uv_timer_start(&timer, timer_cb, 1000, 0);
  ASSERT(r == 0);

  ASSERT(1 == uv_is_active((uv_handle_t*) &timer));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &timer));

  uv_close((uv_handle_t*) &timer, close_cb);

  ASSERT(0 == uv_is_active((uv_handle_t*) &timer));
  ASSERT(1 == uv_is_closing((uv_handle_t*) &timer));

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}